

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment_navxythetamlevlat.cpp
# Opt level: O2

bool __thiscall
EnvironmentNAVXYTHETAMLEVLAT::IsObstacle(EnvironmentNAVXYTHETAMLEVLAT *this,int X,int Y)

{
  uchar ***pppuVar1;
  bool bVar2;
  bool bVar3;
  ulong uVar4;
  ulong uVar5;
  
  bVar2 = EnvironmentNAVXYTHETALATTICE::IsObstacle((EnvironmentNAVXYTHETALATTICE *)this,X,Y);
  bVar3 = true;
  if (!bVar2) {
    uVar5 = 0;
    uVar4 = (ulong)(uint)this->numofadditionalzlevs;
    if (this->numofadditionalzlevs < 1) {
      uVar4 = uVar5;
    }
    do {
      bVar3 = uVar4 != uVar5;
      if (uVar4 == uVar5) {
        return bVar3;
      }
      pppuVar1 = this->AddLevelGrid2D + uVar5;
      uVar5 = uVar5 + 1;
    } while ((*pppuVar1)[X][Y] <
             (this->super_EnvironmentNAVXYTHETALAT).super_EnvironmentNAVXYTHETALATTICE.
             EnvNAVXYTHETALATCfg.obsthresh);
  }
  return bVar3;
}

Assistant:

bool EnvironmentNAVXYTHETAMLEVLAT::IsObstacle(int X, int Y)
{
    int levelind;

    if (EnvironmentNAVXYTHETALAT::IsObstacle(X, Y)) return true;

    //iterate through the additional levels
    for (levelind = 0; levelind < numofadditionalzlevs; levelind++) {
        if (AddLevelGrid2D[levelind][X][Y] >= EnvNAVXYTHETALATCfg.obsthresh) return true;
    }
    //otherwise the cell is obstacle-free at all cells
    return false;
}